

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O3

void __thiscall string_view_cbegin_cend_Test::TestBody(string_view_cbegin_cend_Test *this)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  char local_51;
  Message local_50;
  internal local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  
  lVar2 = 0;
  do {
    local_50.ss_.ptr_._0_4_ = (int)lVar2 + 0x30;
    testing::internal::CmpHelperEQ<int,char>
              (local_48,"\'0\' + count","*iter",(int *)&local_50,"012345" + lVar2);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message(&local_50);
      if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-string-view.cc"
                 ,0x5e,pcVar3);
      testing::internal::AssertHelper::operator=(&local_38,&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (CONCAT44(local_50.ss_.ptr_._4_4_,(int)local_50.ss_.ptr_) == 0) goto LAB_001f147c;
      goto LAB_001f145e;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar2 = lVar2 + 1;
    local_51 = (char)lVar2;
  } while (lVar2 != 6);
  local_50.ss_.ptr_._0_4_ = 6;
  testing::internal::CmpHelperEQ<int,char>(local_48,"6","count",(int *)&local_50,&local_51);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message(&local_50);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-string-view.cc"
               ,0x61,pcVar3);
    testing::internal::AssertHelper::operator=(&local_38,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (CONCAT44(local_50.ss_.ptr_._4_4_,(int)local_50.ss_.ptr_) != 0) {
LAB_001f145e:
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_50.ss_.ptr_._4_4_,(int)local_50.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_50.ss_.ptr_._4_4_,(int)local_50.ss_.ptr_) + 8))();
      }
    }
  }
LAB_001f147c:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(string_view, cbegin_cend) {
  const string_view sv("012345");

  char count = 0;
  for (auto iter = sv.cbegin(), end = sv.cend(); iter != end; ++iter) {
    ASSERT_EQ('0' + count, *iter);
    ++count;
  }
  ASSERT_EQ(6, count);
}